

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fountain.c
# Opt level: O0

void dowatersnakes(void)

{
  boolean bVar1;
  int iVar2;
  char *oldstr;
  monst *mtmp_00;
  trap *ptVar3;
  char *local_20;
  monst *mtmp;
  int num;
  
  iVar2 = rn2(5);
  if ((mvitals[0xde].mvflags & 3) == 0) {
    mtmp._4_4_ = iVar2 + 2;
    if (((u.uprops[0x1e].intrinsic == 0) &&
        (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
         (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
       ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
      if ((u.uprops[0x23].intrinsic == 0) ||
         ((u.uprops[0x24].extrinsic != 0 ||
          ((u.umonnum != u.umonster && (bVar1 = dmgtype(youmonst.data,0x24), bVar1 != '\0')))))) {
        local_20 = "snakes";
      }
      else {
        oldstr = rndmonnam();
        local_20 = makeplural(oldstr);
      }
      pline("An endless stream of %s pours forth!",local_20);
    }
    else {
      You_hear("something hissing!");
    }
    while (iVar2 = mtmp._4_4_ + -1, 0 < mtmp._4_4_) {
      mtmp_00 = makemon(mons + 0xde,level,(int)u.ux,(int)u.uy,0);
      mtmp._4_4_ = iVar2;
      if ((mtmp_00 != (monst *)0x0) &&
         (ptVar3 = t_at(level,(int)mtmp_00->mx,(int)mtmp_00->my), ptVar3 != (trap *)0x0)) {
        mintrap(mtmp_00);
      }
    }
  }
  else {
    pline("The fountain bubbles furiously for a moment, then calms.");
  }
  return;
}

Assistant:

static void dowatersnakes(void) /* Fountain of snakes! */
{
    int num = rn1(5,2);
    struct monst *mtmp;

    if (!(mvitals[PM_WATER_MOCCASIN].mvflags & G_GONE)) {
	if (!Blind)
	    pline("An endless stream of %s pours forth!",
		  Hallucination ? makeplural(rndmonnam()) : "snakes");
	else
	    You_hear("something hissing!");
	while (num-- > 0)
	    if ((mtmp = makemon(&mons[PM_WATER_MOCCASIN], level,
			u.ux, u.uy, NO_MM_FLAGS)) && t_at(level, mtmp->mx, mtmp->my))
		mintrap(mtmp);
    } else
	pline("The fountain bubbles furiously for a moment, then calms.");
}